

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

Element __thiscall ftxui::vtext(ftxui *this,wstring *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<ftxui::(anonymous_namespace)::VText> sVar2;
  Element EVar3;
  string local_48;
  _Alloc_hider local_28;
  size_type sStack_20;
  
  to_string(&local_48,text);
  sVar2 = std::make_shared<ftxui::(anonymous_namespace)::VText,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28)
  ;
  _Var1 = sVar2.super___shared_ptr<ftxui::(anonymous_namespace)::VText,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  *(pointer *)this = local_28._M_p;
  *(size_type *)(this + 8) = sStack_20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX;
  }
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vtext(std::wstring text) {  // NOLINT
  return std::make_shared<VText>(to_string(text));
}